

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall
btSoftBody::defaultCollisionHandler(btSoftBody *this,btCollisionObjectWrapper *pcoWrap)

{
  uint uVar1;
  btCollisionShape *pbVar2;
  btTransform *this_00;
  btCollisionObjectWrapper *in_RSI;
  btCollisionObject *in_RDI;
  float extraout_XMM0_Da;
  btVector3 bVar3;
  CollideCL_RS collider;
  btDbvtVolume volume;
  btVector3 maxs;
  btVector3 mins;
  btScalar basemargin;
  btScalar timemargin;
  btTransform ctr;
  btTransform wtr;
  btRigidBody *prb1;
  CollideSDF_RS docollide;
  btCollisionObject *in_stack_fffffffffffffde8;
  btTransform *in_stack_fffffffffffffdf0;
  btVector3 *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  float fVar4;
  undefined4 in_stack_fffffffffffffe70;
  btDbvtNode *in_stack_fffffffffffffe78;
  btDbvt *in_stack_fffffffffffffe80;
  btVector3 local_158;
  btCollisionObjectWrapper *in_stack_fffffffffffffec0;
  btSoftBody *in_stack_fffffffffffffec8;
  CollideCL_RS *in_stack_fffffffffffffed0;
  btVector3 local_104;
  btVector3 local_f4;
  float local_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  btScalar local_d0;
  btTransform local_cc;
  btTransform local_8c;
  btRigidBody *local_40;
  btCollisionObjectWrapper *local_28;
  btRigidBody *local_20;
  float local_18;
  float local_14;
  btCollisionObjectWrapper *local_10;
  
  uVar1 = (uint)in_RDI[1].m_interpolationLinearVelocity.m_floats[1] & 0xf;
  if (uVar1 == 1) {
    local_10 = in_RSI;
    btSoftColliders::CollideSDF_RS::CollideSDF_RS((CollideSDF_RS *)in_stack_fffffffffffffdf0);
    btCollisionObjectWrapper::getCollisionObject(local_10);
    local_40 = btRigidBody::upcast(in_stack_fffffffffffffde8);
    btCollisionObjectWrapper::getWorldTransform(local_10);
    btTransform::btTransform(in_stack_fffffffffffffdf0,(btTransform *)in_stack_fffffffffffffde8);
    btCollisionObjectWrapper::getWorldTransform(local_10);
    btTransform::btTransform(in_stack_fffffffffffffdf0,(btTransform *)in_stack_fffffffffffffde8);
    btTransform::getOrigin(&local_8c);
    btTransform::getOrigin(&local_cc);
    bVar3 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                      in_stack_fffffffffffffdf8);
    local_d8 = bVar3.m_floats._8_8_;
    local_e0 = bVar3.m_floats._0_8_;
    local_d0 = btVector3::length((btVector3 *)0x27c49e);
    pbVar2 = btCollisionObject::getCollisionShape(in_RDI);
    (*pbVar2->_vptr_btCollisionShape[0xc])();
    fVar4 = extraout_XMM0_Da;
    local_e4 = extraout_XMM0_Da;
    btVector3::btVector3(&local_f4);
    btVector3::btVector3(&local_104);
    btDbvtAabbMm::btDbvtAabbMm((btDbvtAabbMm *)in_stack_fffffffffffffdf0);
    pbVar2 = btCollisionObjectWrapper::getCollisionShape(local_10);
    this_00 = btCollisionObjectWrapper::getWorldTransform(local_10);
    (*pbVar2->_vptr_btCollisionShape[2])(pbVar2,this_00,&local_f4,&local_104);
    btDbvtAabbMm::FromMM((btVector3 *)CONCAT44(fVar4,in_stack_fffffffffffffe00),(btVector3 *)pbVar2)
    ;
    btVector3::btVector3(&local_158,&local_e4,&local_e4,&local_e4);
    btDbvtAabbMm::Expand((btDbvtAabbMm *)this_00,(btVector3 *)in_stack_fffffffffffffde8);
    local_28 = local_10;
    local_20 = local_40;
    local_18 = local_e4 + local_d0;
    local_14 = local_e4;
    btDbvt::collideTV(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                      (btDbvtVolume *)CONCAT44(uVar1,in_stack_fffffffffffffe70),(ICollide *)in_RDI);
    btSoftColliders::CollideSDF_RS::~CollideSDF_RS((CollideSDF_RS *)0x27c671);
  }
  else if (uVar1 == 2) {
    btSoftColliders::CollideCL_RS::CollideCL_RS((CollideCL_RS *)in_stack_fffffffffffffdf0);
    btSoftColliders::CollideCL_RS::ProcessColObj
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    btSoftColliders::CollideCL_RS::~CollideCL_RS((CollideCL_RS *)0x27c6d2);
  }
  return;
}

Assistant:

void			btSoftBody::defaultCollisionHandler(const btCollisionObjectWrapper* pcoWrap)
{

	switch(m_cfg.collisions&fCollision::RVSmask)
	{
	case	fCollision::SDF_RS:
		{
			btSoftColliders::CollideSDF_RS	docollide;		
			btRigidBody*		prb1=(btRigidBody*) btRigidBody::upcast(pcoWrap->getCollisionObject());
			btTransform	wtr=pcoWrap->getWorldTransform();

			const btTransform	ctr=pcoWrap->getWorldTransform();
			const btScalar		timemargin=(wtr.getOrigin()-ctr.getOrigin()).length();
			const btScalar		basemargin=getCollisionShape()->getMargin();
			btVector3			mins;
			btVector3			maxs;
			ATTRIBUTE_ALIGNED16(btDbvtVolume)		volume;
			pcoWrap->getCollisionShape()->getAabb(	pcoWrap->getWorldTransform(),
				mins,
				maxs);
			volume=btDbvtVolume::FromMM(mins,maxs);
			volume.Expand(btVector3(basemargin,basemargin,basemargin));		
			docollide.psb		=	this;
			docollide.m_colObj1Wrap = pcoWrap;
			docollide.m_rigidBody = prb1;

			docollide.dynmargin	=	basemargin+timemargin;
			docollide.stamargin	=	basemargin;
			m_ndbvt.collideTV(m_ndbvt.m_root,volume,docollide);
		}
		break;
	case	fCollision::CL_RS:
		{
			btSoftColliders::CollideCL_RS	collider;
			collider.ProcessColObj(this,pcoWrap);
		}
		break;
	}
}